

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O1

cmCommand * __thiscall cmCTestUpdateCommand::Clone(cmCTestUpdateCommand *this)

{
  cmCTestHandlerCommand *this_00;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xa8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_006a1f58;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestUpdateCommand* ni = new cmCTestUpdateCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }